

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForSingular
              (FieldDescriptor *field)

{
  Type TVar1;
  int result;
  FieldDescriptor *field_local;
  
  TVar1 = FieldDescriptor::type(field);
  if (TVar1 == TYPE_GROUP) {
    field_local._4_4_ = 0x11;
  }
  else if ((int)TVar1 < 10) {
    field_local._4_4_ = TVar1 - TYPE_DOUBLE;
  }
  else {
    field_local._4_4_ = TVar1 - TYPE_FLOAT;
  }
  return field_local._4_4_;
}

Assistant:

int GetExperimentalJavaFieldTypeForSingular(const FieldDescriptor* field) {
  // j/c/g/protobuf/FieldType.java lists field types in a slightly different
  // order from FieldDescriptor::Type so we can't do a simple cast.
  //
  // TODO(xiaofeng): Make j/c/g/protobuf/FieldType.java follow the same order.
  int result = field->type();
  if (result == FieldDescriptor::TYPE_GROUP) {
    return 17;
  } else if (result < FieldDescriptor::TYPE_GROUP) {
    return result - 1;
  } else {
    return result - 2;
  }
}